

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

void arena_reset_finish_background_thread(tsd_t *tsd,uint arena_ind)

{
  background_thread_info_t *pbVar1;
  ulong uVar2;
  
  pbVar1 = background_thread_info;
  if ((background_thread_enabled_state.repr & 1U) != 0) {
    uVar2 = (ulong)arena_ind % max_background_threads;
    malloc_mutex_lock((tsdn_t *)tsd,&background_thread_info[uVar2].mtx);
    pbVar1[uVar2].state = background_thread_started;
    pbVar1[uVar2].mtx.field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&pbVar1[uVar2].mtx.field_0 + 0x40));
  }
  background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  return;
}

Assistant:

static void
arena_reset_finish_background_thread(tsd_t *tsd, unsigned arena_ind) {
	if (have_background_thread) {
		if (background_thread_enabled()) {
			background_thread_info_t *info =
			    background_thread_info_get(arena_ind);
			assert(info->state == background_thread_paused);
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			info->state = background_thread_started;
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
		malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);
	}
}